

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O1

void __thiscall
Memory::LargeHeapBlock::SetTrackerData(LargeHeapBlock *this,void *address,void *data)

{
  uint uVar1;
  uint uVar2;
  undefined4 *puVar3;
  code *pcVar4;
  bool bVar5;
  LargeObjectHeader *pLVar6;
  undefined8 *in_FS_OFFSET;
  
  bVar5 = Recycler::DoProfileAllocTracker();
  if (!bVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)*in_FS_OFFSET;
    *puVar3 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x934,"(Recycler::DoProfileAllocTracker())",
                       "Recycler::DoProfileAllocTracker()");
    if (!bVar5) goto LAB_0024951d;
    *puVar3 = 0;
  }
  pLVar6 = GetHeader(this,address);
  if (pLVar6 < (LargeObjectHeader *)(this->super_HeapBlock).address) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)*in_FS_OFFSET;
    *puVar3 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x936,"((char *)header >= this->address)","(char *)header >= this->address")
    ;
    if (!bVar5) goto LAB_0024951d;
    *puVar3 = 0;
  }
  uVar1 = pLVar6->objectIndex;
  if (this->allocCount <= uVar1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)*in_FS_OFFSET;
    *puVar3 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x938,"(index < this->allocCount)","index < this->allocCount");
    if (!bVar5) goto LAB_0024951d;
    *puVar3 = 0;
  }
  if ((LargeObjectHeader *)(&this[1].super_HeapBlock._vptr_HeapBlock)[uVar1] != pLVar6) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)*in_FS_OFFSET;
    *puVar3 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x939,"(this->HeaderList()[index] == header)",
                       "this->HeaderList()[index] == header");
    if (!bVar5) {
LAB_0024951d:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar3 = 0;
  }
  uVar2 = this->objectCount;
  bVar5 = Recycler::DoProfileAllocTracker();
  *(void **)((long)this +
            (ulong)uVar1 * 8 + (ulong)this->objectCount * -8 + ((ulong)uVar2 << bVar5 + 3) + 0xb8) =
       data;
  return;
}

Assistant:

void
LargeHeapBlock::SetTrackerData(void * address, void * data)
{
    Assert(Recycler::DoProfileAllocTracker());
    LargeObjectHeader * header = GetHeader(address);
    Assert((char *)header >= this->address);
    uint index = header->objectIndex;
    Assert(index < this->allocCount);
    Assert(this->HeaderList()[index] == header);
    this->GetTrackerDataArray()[index] = data;
}